

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

ITexture * __thiscall
irr::video::CNullDriver::loadTextureFromFile(CNullDriver *this,IReadFile *file,path *hashName)

{
  bool bVar1;
  int iVar2;
  u32 uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 in_RDX;
  long *in_RSI;
  CNullDriver *in_RDI;
  double __x;
  IImage *image;
  ITexture *texture;
  IReferenceCounted *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  ITexture *local_28;
  ITexture *local_8;
  IImage *image_00;
  
  local_28 = (ITexture *)0x0;
  iVar2 = (*(in_RDI->super_IVideoDriver)._vptr_IVideoDriver[0x46])(in_RDI,in_RSI);
  image_00 = (IImage *)CONCAT44(extraout_var,iVar2);
  if (image_00 == (IImage *)0x0) {
    local_8 = (ITexture *)0x0;
  }
  else {
    bVar1 = checkImage(in_RDI,image_00);
    if (bVar1) {
      uVar3 = core::string<char>::size((string<char> *)0x30a0de);
      local_40 = in_RDX;
      if (uVar3 == 0) {
        local_40 = (**(code **)(*in_RSI + 0x20))();
      }
      iVar2 = (*(in_RDI->super_IVideoDriver)._vptr_IVideoDriver[0x75])(in_RDI,local_40,image_00);
      local_28 = (ITexture *)CONCAT44(extraout_var_00,iVar2);
      if (local_28 != (ITexture *)0x0) {
        __x = (double)(**(code **)(*in_RSI + 0x20))();
        os::Printer::log(__x);
      }
    }
    IReferenceCounted::drop(in_stack_ffffffffffffffb8);
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

video::ITexture *CNullDriver::loadTextureFromFile(io::IReadFile *file, const io::path &hashName)
{
	ITexture *texture = nullptr;

	IImage *image = createImageFromFile(file);
	if (!image)
		return nullptr;

	if (checkImage(image)) {
		texture = createDeviceDependentTexture(hashName.size() ? hashName : file->getFileName(), image);
		if (texture)
			os::Printer::log("Loaded texture", file->getFileName(), ELL_DEBUG);
	}

	image->drop();

	return texture;
}